

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Session::~Session(Session *this)

{
  Session *this_local;
  
  ~Session(this);
  operator_delete(this,400);
  return;
}

Assistant:

Session::~Session() {
        Catch::cleanUp();
    }